

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtppacket.cpp
# Opt level: O3

void __thiscall
jrtplib::RTPPacket::RTPPacket(RTPPacket *this,RTPRawPacket *rawpack,RTPMemoryManager *mgr)

{
  int iVar1;
  
  (this->super_RTPMemoryObject).mgr = mgr;
  (this->super_RTPMemoryObject)._vptr_RTPMemoryObject = (_func_int **)&PTR__RTPPacket_0013cb90;
  (this->receivetime).m_t = (rawpack->receivetime).m_t;
  this->hasextension = false;
  this->hasmarker = false;
  this->numcsrcs = 0;
  this->payloadtype = '\0';
  this->extseqnr = 0;
  this->timestamp = 0;
  this->ssrc = 0;
  this->error = 0;
  this->packet = (uint8_t *)0x0;
  this->payload = (uint8_t *)0x0;
  this->packetlength = 0;
  this->payloadlength = 0;
  this->extid = 0;
  this->extension = (uint8_t *)0x0;
  this->extensionlength = 0;
  this->externalbuffer = false;
  iVar1 = ParseRawPacket(this,rawpack);
  this->error = iVar1;
  return;
}

Assistant:

RTPPacket::RTPPacket(RTPRawPacket &rawpack,RTPMemoryManager *mgr) : RTPMemoryObject(mgr),receivetime(rawpack.GetReceiveTime())
{
	Clear();
	error = ParseRawPacket(rawpack);
}